

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O3

int __thiscall
zmq::ip_resolver_t::resolve_nic_name(ip_resolver_t *this,ip_addr_t *ip_addr_,char *nic_)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  short *__src;
  int iVar4;
  uint *puVar5;
  ulong extraout_RAX;
  size_t __n;
  int i;
  int iVar6;
  long *plVar7;
  long *plVar8;
  ifaddrs *ifa;
  long *local_48;
  ip_addr_t *local_40;
  long *local_38;
  
  local_48 = (long *)0x0;
  iVar6 = 0;
  do {
    iVar4 = getifaddrs(&local_48);
    if (iVar4 == 0) goto LAB_00190925;
    if (iVar4 < 0) {
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      if (uVar3 != 0x6f) goto LAB_00190916;
    }
    usleep(1000 << ((byte)iVar6 & 0x1f));
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10);
  puVar5 = (uint *)__errno_location();
  uVar3 = *puVar5;
LAB_00190916:
  if ((uVar3 != 0x5f) && (uVar3 != 0x16)) {
    resolve_nic_name((ip_resolver_t *)(ulong)uVar3);
LAB_00190925:
    plVar7 = local_48;
    if ((local_48 == (long *)0x0) &&
       (resolve_nic_name(), plVar7 = local_38, (extraout_RAX & 1) != 0)) {
      plVar7 = (long *)0x0;
    }
    else {
      bVar1 = (this->_options)._ipv6_wanted;
      plVar8 = plVar7;
      local_40 = ip_addr_;
      do {
        __src = (short *)plVar8[3];
        if (((__src != (short *)0x0) && (sVar2 = *__src, (ushort)((bVar1 & 1) * 8 + 2) == sVar2)) &&
           (iVar6 = strcmp(nic_,(char *)plVar8[1]), iVar6 == 0)) {
          __n = 0x1c;
          if (sVar2 == 2) {
            __n = 0x10;
          }
          memcpy(local_40,__src,__n);
          freeifaddrs(plVar7);
          return 0;
        }
        plVar8 = (long *)*plVar8;
      } while (plVar8 != (long *)0x0);
    }
    freeifaddrs(plVar7);
    puVar5 = (uint *)__errno_location();
  }
  *puVar5 = 0x13;
  return -1;
}

Assistant:

int zmq::ip_resolver_t::resolve_nic_name (ip_addr_t *ip_addr_, const char *nic_)
{
    //  Get the addresses.
    ifaddrs *ifa = NULL;
    int rc = 0;
    const int max_attempts = 10;
    const int backoff_msec = 1;
    for (int i = 0; i < max_attempts; i++) {
        rc = getifaddrs (&ifa);
        if (rc == 0 || (rc < 0 && errno != ECONNREFUSED))
            break;
        usleep ((backoff_msec << i) * 1000);
    }

    if (rc != 0 && ((errno == EINVAL) || (errno == EOPNOTSUPP))) {
        // Windows Subsystem for Linux compatibility
        errno = ENODEV;
        return -1;
    }
    errno_assert (rc == 0);
    zmq_assert (ifa != NULL);

    //  Find the corresponding network interface.
    bool found = false;
    for (const ifaddrs *ifp = ifa; ifp != NULL; ifp = ifp->ifa_next) {
        if (ifp->ifa_addr == NULL)
            continue;

        const int family = ifp->ifa_addr->sa_family;
        if (family == (_options.ipv6 () ? AF_INET6 : AF_INET)
            && !strcmp (nic_, ifp->ifa_name)) {
            memcpy (ip_addr_, ifp->ifa_addr,
                    (family == AF_INET) ? sizeof (struct sockaddr_in)
                                        : sizeof (struct sockaddr_in6));
            found = true;
            break;
        }
    }

    //  Clean-up;
    freeifaddrs (ifa);

    if (!found) {
        errno = ENODEV;
        return -1;
    }
    return 0;
}